

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_DeadReckoningParameter.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::LE_DeadReckoningParameter::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,LE_DeadReckoningParameter *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"LE Dead Reckoning Parameters:\n");
  poVar1 = std::operator<<(poVar1,"\tAlgorithm:          ");
  ENUMS::GetEnumAsStringDeadReckoningAlgorithm_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui8DeadRecknoningAlgorithm,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tLinear Acceleration: ");
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,(unsigned_char)3>>::GetAsString_abi_cxx11_
            (&local_1e0,&this->m_LinearAcceleration);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\tAngular Velocity:    ");
  LE_Vector<KDIS::DATA_TYPE::KFIXED<char,(unsigned_char)3>>::GetAsString_abi_cxx11_
            (&local_200,&this->m_AngularVelocity);
  std::operator<<(poVar1,(string *)&local_200);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString LE_DeadReckoningParameter::GetAsString() const
{
    KStringStream ss;

    ss << "LE Dead Reckoning Parameters:\n"
       << "\tAlgorithm:          "   << GetEnumAsStringDeadReckoningAlgorithm( m_ui8DeadRecknoningAlgorithm )
       << "\n\tLinear Acceleration: " << m_LinearAcceleration.GetAsString()
       << "\tAngular Velocity:    "   << m_AngularVelocity.GetAsString();

    return ss.str();
}